

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gesture_acts.cpp
# Opt level: O3

void __thiscall gesture_acts::gesture_acts(gesture_acts *this)

{
  (this->uid)._M_dataplus._M_p = (pointer)&(this->uid).field_2;
  (this->uid)._M_string_length = 0;
  (this->uid).field_2._M_local_buf[0] = '\0';
  (this->vec_dr).super__Vector_base<datarow,_std::allocator<datarow>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vec_dr).super__Vector_base<datarow,_std::allocator<datarow>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vec_dr).super__Vector_base<datarow,_std::allocator<datarow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->id = 0;
  std::__cxx11::string::_M_replace((ulong)&this->uid,0,(char *)0x0,0x10402d);
  this->age = 0;
  this->gender = false;
  this->hand = false;
  this->gid = -1;
  return;
}

Assistant:

gesture_acts::gesture_acts(){
    this->id = 0;
    this->uid = "";
    this->age = 0;
    this->gender = false;
    this->hand = false;
    this->gid = -1;
}